

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

void __thiscall SQClassMember::Null(SQClassMember *this)

{
  SQClassMember *this_local;
  
  ::SQObjectPtr::Null(&this->val);
  ::SQObjectPtr::Null(&this->attrs);
  return;
}

Assistant:

void Null() {
        val.Null();
        attrs.Null();
    }